

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

bool CNscPStackEntry::IsSimpleVariable(uchar *pauchData,size_t nDataSize)

{
  bool local_19;
  NscPCodeVariable *pv;
  size_t nDataSize_local;
  uchar *pauchData_local;
  
  local_19 = false;
  if ((((nDataSize != 0) && (local_19 = false, *(size_t *)pauchData == nDataSize)) &&
      (local_19 = false, *(int *)(pauchData + 8) == 0)) &&
     (local_19 = false, (*(uint *)(pauchData + 0x28) & 0x3c) == 0)) {
    local_19 = (*(uint *)(pauchData + 0x28) & 0x80) == 0;
  }
  return local_19;
}

Assistant:

static bool IsSimpleVariable (const unsigned char *pauchData, size_t nDataSize) 
	{
		NscPCodeVariable *pv = (NscPCodeVariable *) pauchData;
		return nDataSize != 0 &&
			pv ->nOpSize == nDataSize &&
			pv ->nOpCode == NscPCode_Variable &&
			(pv ->ulFlags & NscSymFlag_Increments) == 0 &&
			(pv ->ulFlags & NscSymFlag_Constant) == 0;
	}